

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QFileDialogPrivate::HistoryItem>::Inserter::insertOne
          (Inserter *this,qsizetype pos,HistoryItem *t)

{
  HistoryItem *pHVar1;
  qsizetype qVar2;
  HistoryItem *pHVar3;
  undefined8 uVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  Data *pDVar7;
  QPersistentModelIndex *pQVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  
  pHVar1 = this->begin;
  lVar10 = this->size;
  pHVar3 = pHVar1 + lVar10;
  this->end = pHVar3;
  this->last = pHVar1 + lVar10 + -1;
  this->where = pHVar1 + pos;
  lVar10 = lVar10 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar10;
  this->sourceCopyAssign = 1;
  if (0 < lVar10) {
    pDVar5 = pHVar3[-1].path.d.d;
    pcVar6 = pHVar3[-1].path.d.ptr;
    pHVar3[-1].path.d.d = (Data *)0x0;
    pHVar3[-1].path.d.ptr = (char16_t *)0x0;
    (pHVar3->path).d.d = pDVar5;
    (pHVar3->path).d.ptr = pcVar6;
    qVar2 = pHVar3[-1].path.d.size;
    pHVar3[-1].path.d.size = 0;
    (pHVar3->path).d.size = qVar2;
    pDVar7 = pHVar3[-1].selection.d.d;
    pQVar8 = pHVar3[-1].selection.d.ptr;
    pHVar3[-1].selection.d.d = (Data *)0x0;
    pHVar3[-1].selection.d.ptr = (QPersistentModelIndex *)0x0;
    (pHVar3->selection).d.d = pDVar7;
    (pHVar3->selection).d.ptr = pQVar8;
    qVar2 = pHVar3[-1].selection.d.size;
    pHVar3[-1].selection.d.size = 0;
    (pHVar3->selection).d.size = qVar2;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar11 = 0x18;
      lVar10 = 0;
      do {
        pHVar3 = this->last;
        uVar4 = *(undefined8 *)((long)pHVar3 + lVar11 + -0x18);
        uVar9 = *(undefined8 *)((long)pHVar3 + lVar11 + -0x10);
        *(undefined8 *)((long)pHVar3 + lVar11 + -0x18) =
             *(undefined8 *)((long)pHVar3 + lVar11 + -0x48);
        *(undefined8 *)((long)pHVar3 + lVar11 + -0x10) =
             *(undefined8 *)((long)pHVar3 + lVar11 + -0x40);
        *(undefined8 *)((long)pHVar3 + lVar11 + -0x48) = uVar4;
        *(undefined8 *)((long)pHVar3 + lVar11 + -0x40) = uVar9;
        uVar4 = *(undefined8 *)((long)pHVar3 + lVar11 + -8);
        *(undefined8 *)((long)pHVar3 + lVar11 + -8) = *(undefined8 *)((long)pHVar3 + lVar11 + -0x38)
        ;
        *(undefined8 *)((long)pHVar3 + lVar11 + -0x38) = uVar4;
        QArrayDataPointer<QPersistentModelIndex>::operator=
                  ((QArrayDataPointer<QPersistentModelIndex> *)((long)&(pHVar3->path).d.d + lVar11),
                   (QArrayDataPointer<QPersistentModelIndex> *)((long)&pHVar3[-1].path.d.d + lVar11)
                  );
        lVar10 = lVar10 + -1;
        lVar11 = lVar11 + -0x30;
      } while (lVar10 != this->move);
    }
    pHVar3 = this->where;
    pDVar5 = (pHVar3->path).d.d;
    (pHVar3->path).d.d = (t->path).d.d;
    (t->path).d.d = pDVar5;
    pcVar6 = (pHVar3->path).d.ptr;
    (pHVar3->path).d.ptr = (t->path).d.ptr;
    (t->path).d.ptr = pcVar6;
    qVar2 = (pHVar3->path).d.size;
    (pHVar3->path).d.size = (t->path).d.size;
    (t->path).d.size = qVar2;
    QArrayDataPointer<QPersistentModelIndex>::operator=(&(pHVar3->selection).d,&(t->selection).d);
    return;
  }
  this->sourceCopyConstruct = 1 - lVar10;
  this->move = 0;
  this->sourceCopyAssign = lVar10;
  pDVar5 = (t->path).d.d;
  (t->path).d.d = (Data *)0x0;
  (pHVar3->path).d.d = pDVar5;
  pcVar6 = (t->path).d.ptr;
  (t->path).d.ptr = (char16_t *)0x0;
  (pHVar3->path).d.ptr = pcVar6;
  qVar2 = (t->path).d.size;
  (t->path).d.size = 0;
  (pHVar3->path).d.size = qVar2;
  pDVar7 = (t->selection).d.d;
  (t->selection).d.d = (Data *)0x0;
  (pHVar3->selection).d.d = pDVar7;
  pQVar8 = (t->selection).d.ptr;
  (t->selection).d.ptr = (QPersistentModelIndex *)0x0;
  (pHVar3->selection).d.ptr = pQVar8;
  qVar2 = (t->selection).d.size;
  (t->selection).d.size = 0;
  (pHVar3->selection).d.size = qVar2;
  this->size = this->size + 1;
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }